

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcRtFileFont.cpp
# Opt level: O0

GrcRtFileFont * __thiscall GrcRtFileFont::copyThis(GrcRtFileFont *this)

{
  GrcRtFileFont *pGVar1;
  GrcRtFileFont *in_RDI;
  GrcRtFileFont *copy;
  GrcRtFileFont *in_stack_ffffffffffffffc8;
  
  pGVar1 = (GrcRtFileFont *)operator_new(0x68);
  GrcRtFileFont(in_RDI,in_stack_ffffffffffffffc8);
  return pGVar1;
}

Assistant:

GrcRtFileFont * GrcRtFileFont::copyThis()
{
	GrcRtFileFont * copy = new GrcRtFileFont(*this);
	return copy;
}